

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O2

_vector3<float> * __thiscall
xray_re::_vector3<float>::cross_product(_vector3<float> *this,_vector3<float> *v)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = (v->field_0).field_0.x;
  fVar2 = (this->field_0).field_0.x;
  uVar3 = *(undefined8 *)((long)&this->field_0 + 4);
  uVar4 = *(undefined8 *)((long)&v->field_0 + 4);
  fVar5 = (float)uVar3;
  fVar6 = (float)((ulong)uVar3 >> 0x20);
  fVar7 = (float)uVar4;
  fVar8 = (float)((ulong)uVar4 >> 0x20);
  (this->field_0).field_0.z = fVar2 * fVar7 - fVar1 * fVar5;
  *(ulong *)&this->field_0 = CONCAT44(fVar1 * fVar6 - fVar2 * fVar8,fVar8 * fVar5 - fVar6 * fVar7);
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::cross_product(const _vector3<T>& v)
{
	T _x = y*v.z - z*v.y;
	T _y = z*v.x - x*v.z;
	z = x*v.y - y*v.x;
	x = _x;
	y = _y;
	return *this;
}